

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTo.hpp
# Opt level: O3

bool __thiscall
ut11::Operands::IsIterableEquivalentTo<std::vector<int,std::allocator<int>>>::operator()
          (IsIterableEquivalentTo<std::vector<int,std::allocator<int>>> *this,
          vector<int,_std::allocator<int>_> *actual)

{
  _List_node_base *p_Var1;
  bool bVar2;
  bool bVar3;
  list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  expectedIterators;
  list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  actualIterators;
  list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_58;
  _List_node_base local_40;
  
  IsIterableEquivalentTo<std::vector<int,_std::allocator<int>_>_>::
  CreateIteratorListFromInput<std::vector<int,_std::allocator<int>_>_>
            ((list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)&local_40,actual);
  IsIterableEquivalentTo<std::vector<int,_std::allocator<int>_>_>::
  CreateIteratorListFromInput<std::vector<int,_std::allocator<int>_>_>
            (&local_58,*(vector<int,_std::allocator<int>_> **)this);
  do {
    bVar3 = local_58.
            super__List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_58 &&
            local_40._M_next == &local_40;
    if (bVar3) break;
    bVar2 = CompareListsAndRemoveFirstDuplicate<std::__cxx11::list<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::allocator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>,std::__cxx11::list<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::allocator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>>
                      (&local_58,
                       (list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                        *)&local_40);
  } while (bVar2);
  if (local_58.
      super__List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_58) {
    do {
      p_Var1 = (local_58.
                super__List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
      operator_delete(local_58.
                      super__List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next);
      local_58.
      super__List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = p_Var1;
    } while (p_Var1 != (_List_node_base *)&local_58);
  }
  while (local_40._M_next != &local_40) {
    p_Var1 = (((_List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                *)&(local_40._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(local_40._M_next);
    local_40._M_next = p_Var1;
  }
  return bVar3;
}

Assistant:

bool operator()(const U& actual) const
			{
				auto actualIterators = CreateIteratorListFromInput(actual);
				auto expectedIterators = CreateIteratorListFromInput(m_expected);

				while(!actualIterators.empty() || !expectedIterators.empty() )
				{
					if  (CompareListsAndRemoveFirstDuplicate(expectedIterators, actualIterators))
						continue;

					return false;
				}
				return true;
			}